

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::SoPlexBase<double>::writeFile
          (SoPlexBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *intVars,bool unscale,bool writeZeroObjective)

{
  Verbosity VVar1;
  ostream *poVar2;
  char cVar3;
  SPxLPBase<double> *this_00;
  undefined7 in_register_00000089;
  SPxLPBase<double> *origLP;
  SPxLPBase<double> *local_38;
  
  if (((int)CONCAT71(in_register_00000089,unscale) == 0) || (this->_realLP->_isScaled != true)) {
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x22])
              (this->_realLP,filename,rowNames,colNames,intVars,(ulong)writeZeroObjective);
  }
  else {
    VVar1 = (this->spxout).m_verbosity;
    if (4 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[5],"copy LP to write unscaled original problem",0x2a);
      poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar3 = (char)poVar2;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar1;
    }
    local_38 = (SPxLPBase<double> *)0x0;
    spx_alloc<soplex::SPxLPBase<double>*>(&local_38,1);
    this_00 = local_38;
    SPxLPBase<double>::SPxLPBase(local_38,this->_realLP);
    local_38 = this_00;
    SPxLPBase<double>::unscaleLP(this_00);
    (*(local_38->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x22])
              (local_38,filename,rowNames,colNames,intVars,(ulong)writeZeroObjective);
    (**(local_38->super_LPRowSetBase<double>).super_SVSetBase<double>.
       super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)();
    free(local_38);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::writeFile(const char* filename, const NameSet* rowNames,
                              const NameSet* colNames, const DIdxSet* intVars, const bool unscale,
                              const bool writeZeroObjective) const
{
   ///@todo implement return value
   if(unscale && _realLP->isScaled())
   {
      SPX_MSG_INFO3(spxout, spxout << "copy LP to write unscaled original problem" << std::endl;)
      SPxLPBase<R>* origLP;
      origLP = nullptr;
      spx_alloc(origLP);
      origLP = new(origLP) SPxLPBase<R>(*_realLP);
      origLP->unscaleLP();
      origLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);
      origLP->~SPxLPBase<R>();
      spx_free(origLP);
   }
   else
      _realLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);

   return true;
}